

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
fetch(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
     node_t *parent,
     vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
     *siblings)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
  *in_RDX;
  long in_RSI;
  long in_RDI;
  node_t tmp_node;
  uint cur;
  uchar *tmp;
  size_t i;
  uint prev;
  char *in_stack_ffffffffffffff58;
  Length<char> *in_stack_ffffffffffffff60;
  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
  *this_00;
  value_type *in_stack_ffffffffffffff68;
  size_t sVar5;
  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
  *in_stack_ffffffffffffff70;
  size_t local_80;
  ulong local_78;
  uint local_44;
  ulong local_30;
  uint local_24;
  size_type local_8;
  
  if (*(int *)(in_RDI + 0x54) < 0) {
    local_8 = 0;
  }
  else {
    local_24 = 0;
    for (local_30 = *(ulong *)(in_RSI + 0x10); local_30 < *(ulong *)(in_RSI + 0x18);
        local_30 = local_30 + 1) {
      if (*(long *)(in_RDI + 0x30) == 0) {
        local_78 = Length<char>::operator()(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      else {
        local_78 = *(ulong *)(*(long *)(in_RDI + 0x30) + local_30 * 8);
      }
      if (*(ulong *)(in_RSI + 8) <= local_78) {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x20) + local_30 * 8);
        local_44 = 0;
        if (*(long *)(in_RDI + 0x30) == 0) {
          local_80 = Length<char>::operator()(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        else {
          local_80 = *(size_t *)(*(long *)(in_RDI + 0x30) + local_30 * 8);
        }
        if (local_80 != *(size_t *)(in_RSI + 8)) {
          local_44 = *(byte *)(lVar1 + *(long *)(in_RSI + 8)) + 1;
        }
        if (local_44 < local_24) {
          *(undefined4 *)(in_RDI + 0x54) = 0xfffffffd;
          return 0;
        }
        if ((local_44 != local_24) ||
           (bVar2 = std::
                    vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                    ::empty(in_stack_ffffffffffffff70), bVar2)) {
          bVar2 = std::
                  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                  ::empty(in_stack_ffffffffffffff70);
          if (!bVar2) {
            in_stack_ffffffffffffff70 = in_RDX;
            sVar3 = std::
                    vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                    ::size(in_RDX);
            pvVar4 = std::
                     vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                     ::operator[](in_stack_ffffffffffffff70,sVar3 - 1);
            pvVar4->right = local_30;
          }
          std::
          vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        }
        local_24 = local_44;
      }
    }
    bVar2 = std::
            vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
            ::empty(in_stack_ffffffffffffff70);
    if (!bVar2) {
      sVar5 = *(size_t *)(in_RSI + 0x18);
      this_00 = in_RDX;
      sVar3 = std::
              vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              ::size(in_RDX);
      pvVar4 = std::
               vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
               ::operator[](this_00,sVar3 - 1);
      pvVar4->right = sVar5;
    }
    local_8 = std::
              vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              ::size(in_RDX);
  }
  return local_8;
}

Assistant:

size_t fetch(const node_t &parent, std::vector <node_t> &siblings) {
    if (error_ < 0) return 0;

    array_u_type_ prev = 0;

    for (size_t i = parent.left; i < parent.right; ++i) {
      if ((length_ ? length_[i] : length_func_()(key_[i])) < parent.depth)
        continue;

      const node_u_type_ *tmp = reinterpret_cast<node_u_type_ *>(key_[i]);

      array_u_type_ cur = 0;
      if ((length_ ? length_[i] : length_func_()(key_[i])) != parent.depth)
        cur = (array_u_type_)tmp[parent.depth] + 1;

      if (prev > cur) {
        error_ = -3;
        return 0;
      }

      if (cur != prev || siblings.empty()) {
        node_t tmp_node;
        tmp_node.depth = parent.depth + 1;
        tmp_node.code  = cur;
        tmp_node.left  = i;
        if (!siblings.empty()) siblings[siblings.size()-1].right = i;

        siblings.push_back(tmp_node);
      }

      prev = cur;
    }

    if (!siblings.empty())
      siblings[siblings.size()-1].right = parent.right;

    return siblings.size();
  }